

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

string * __thiscall
flatbuffers::ts::TsGenerator::GenUnionValTS
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,StructDef *dependent
          ,string *field_name,Type *union_type,bool is_array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  EnumDef *dependency;
  pointer ppEVar4;
  long *plVar5;
  undefined8 *puVar6;
  string *extraout_RAX;
  string *psVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  undefined8 uVar11;
  EnumDef *union_enum;
  string conversion_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_binded_method;
  string enum_type;
  string union_accessor;
  long *local_278;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  pointer local_190;
  EnumVal **local_188;
  undefined1 local_180 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  ImportDefinition local_100;
  
  dependency = union_type->enum_def;
  if (dependency == (EnumDef *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                  ,0x454,
                  "std::string flatbuffers::ts::TsGenerator::GenUnionValTS(import_set &, const StructDef &, const std::string &, const Type &, const bool)"
                 );
  }
  union_enum = (EnumDef *)union_type;
  AddImport<flatbuffers::EnumDef>(&local_100,this,imports,&dependent->super_Definition,dependency);
  local_180._0_8_ = local_180 + 0x10;
  paVar1 = &local_100.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.name._M_dataplus._M_p == paVar1) {
    local_180._24_8_ = local_100.name.field_2._8_8_;
  }
  else {
    local_180._0_8_ = local_100.name._M_dataplus._M_p;
  }
  local_180._17_7_ = local_100.name.field_2._M_allocated_capacity._1_7_;
  local_180[0x10] = local_100.name.field_2._M_local_buf[0];
  local_180._8_8_ = local_100.name._M_string_length;
  local_100.name._M_string_length = 0;
  local_100.name.field_2._M_local_buf[0] = '\0';
  local_100.name._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.object_name._M_dataplus._M_p != &local_100.object_name.field_2) {
    operator_delete(local_100.object_name._M_dataplus._M_p,
                    local_100.object_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.rel_file_path._M_dataplus._M_p != &local_100.rel_file_path.field_2) {
    operator_delete(local_100.rel_file_path._M_dataplus._M_p,
                    local_100.rel_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.bare_file_path._M_dataplus._M_p != &local_100.bare_file_path.field_2) {
    operator_delete(local_100.bare_file_path._M_dataplus._M_p,
                    local_100.bare_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.export_statement._M_dataplus._M_p != &local_100.export_statement.field_2) {
    operator_delete(local_100.export_statement._M_dataplus._M_p,
                    local_100.export_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.import_statement._M_dataplus._M_p != &local_100.import_statement.field_2) {
    operator_delete(local_100.import_statement._M_dataplus._M_p,
                    local_100.import_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_100.name._M_dataplus._M_p,
                    CONCAT71(local_100.name.field_2._M_allocated_capacity._1_7_,
                             local_100.name.field_2._M_local_buf[0]) + 1);
  }
  std::operator+(&local_100.name,"this.",field_name);
  ppEVar4 = (dependency->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_188 = (EnumVal **)
              std::
              __find_if<__gnu_cxx::__normal_iterator<flatbuffers::EnumVal*const*,std::vector<flatbuffers::EnumVal*,std::allocator<flatbuffers::EnumVal*>>>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::ts::TsGenerator::UnionHasStringType(flatbuffers::EnumDef_const&)::_lambda(flatbuffers::EnumVal_const*)_1_>>
                        ((dependency->vals).vec.
                         super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,ppEVar4);
  std::operator+(&local_1f8,"this.",field_name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_1b8 = &local_1a8;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_1a8 = *plVar8;
    lStack_1a0 = plVar5[3];
  }
  else {
    local_1a8 = *plVar8;
    local_1b8 = (long *)*plVar5;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_190 = ppEVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_198 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_198;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (is_array) {
    GenUnionListConvFuncName_abi_cxx11_(&local_1f8,this,dependency);
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x36f547);
    GenObjApiUnionTypeTS
              (&local_238,this,imports,union_type->struct_def,(IDLOptions *)union_type->enum_def,
               union_enum);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x36f5e7);
    paVar1 = &local_258.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_238.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"TypeLength","");
    Namer::Method(&local_218,&(this->namer_).super_Namer,field_name,&local_1d8);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x36f603);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_238.field_2._M_allocated_capacity = *psVar9;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar9;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Type","");
    Namer::Method(&local_238,&(this->namer_).super_Namer,field_name,&local_218);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x36f65f);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_258,"      if(targetEnum === null || ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_218,"      const temp = ",&local_1f8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_238.field_2._M_allocated_capacity = *psVar9;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar9;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1b8);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258.field_2._8_8_ = plVar5[3];
      local_258._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar9;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar5[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00257141;
  }
  GenUnionConvFuncName_abi_cxx11_(&local_1f8,this,dependency);
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             0x36f547);
  std::operator+(&local_120,"      const temp = ",&local_1f8);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
  paVar1 = &local_1d8.field_2;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_1d8.field_2._M_allocated_capacity = *puVar10;
    local_1d8.field_2._8_4_ = (undefined4)plVar5[3];
    local_1d8.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *puVar10;
    local_1d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1d8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Type","");
  Namer::Method((string *)&local_160,&(this->namer_).super_Namer,field_name,&local_140);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    uVar11 = local_1d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_160._8_8_ + local_1d8._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_allocated_capacity != &local_150) {
      uVar11 = local_150._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_160._8_8_ + local_1d8._M_string_length) goto LAB_00256807;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_160,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
  }
  else {
LAB_00256807:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d8,local_160._M_allocated_capacity);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_218.field_2._M_allocated_capacity = *psVar9;
    local_218.field_2._8_8_ = puVar6[3];
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar9;
    local_218._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_218._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_238.field_2._M_allocated_capacity = *psVar9;
    local_238.field_2._8_8_ = plVar5[3];
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar9;
    local_238._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_238._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1b8);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_258.field_2._M_allocated_capacity = *psVar9;
    local_258.field_2._8_8_ = plVar5[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar9;
    local_258._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_258._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_268 = *plVar8;
    lStack_260 = plVar5[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *plVar8;
    local_278 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278);
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_allocated_capacity != &local_150) {
    operator_delete((void *)local_160._M_allocated_capacity,local_150._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00257141:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
    operator_delete(local_100.name._M_dataplus._M_p,
                    CONCAT71(local_100.name.field_2._M_allocated_capacity._1_7_,
                             local_100.name.field_2._M_local_buf[0]) + 1);
  }
  psVar7 = (string *)(local_180 + 0x10);
  if ((string *)local_180._0_8_ != psVar7) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    psVar7 = extraout_RAX;
  }
  return psVar7;
}

Assistant:

std::string GenUnionValTS(import_set &imports, const StructDef &dependent,
                            const std::string &field_name,
                            const Type &union_type,
                            const bool is_array = false) {
    if (union_type.enum_def) {
      const auto &enum_def = *union_type.enum_def;
      const auto enum_type = AddImport(imports, dependent, enum_def).name;
      const std::string union_accessor = "this." + field_name;

      const auto union_has_string = UnionHasStringType(enum_def);
      const auto field_binded_method = "this." + field_name + ".bind(this)";

      std::string ret;

      if (!is_array) {
        const auto conversion_function = GenUnionConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "      const temp = " + conversion_function + "(this." +
               namer_.Method(field_name, "Type") + "(), " +
               field_binded_method + ");\n";
        ret += "      if(temp === null) { return null; }\n";
        ret += union_has_string
                   ? "      if(typeof temp === 'string') { return temp; }\n"
                   : "";
        ret += "      return temp.unpack()\n";
        ret += "  })()";
      } else {
        const auto conversion_function = GenUnionListConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "    const ret: (" +
               GenObjApiUnionTypeTS(imports, *union_type.struct_def,
                                    parser_.opts, *union_type.enum_def) +
               ")[] = [];\n";
        ret += "    for(let targetEnumIndex = 0; targetEnumIndex < this." +
               namer_.Method(field_name, "TypeLength") + "()" +
               "; "
               "++targetEnumIndex) {\n";
        ret += "      const targetEnum = this." +
               namer_.Method(field_name, "Type") + "(targetEnumIndex);\n";
        ret += "      if(targetEnum === null || " + enum_type +
               "[targetEnum!] === 'NONE') { "
               "continue; }\n\n";
        ret += "      const temp = " + conversion_function + "(targetEnum, " +
               field_binded_method + ", targetEnumIndex);\n";
        ret += "      if(temp === null) { continue; }\n";
        ret += union_has_string ? "      if(typeof temp === 'string') { "
                                  "ret.push(temp); continue; }\n"
                                : "";
        ret += "      ret.push(temp.unpack());\n";
        ret += "    }\n";
        ret += "    return ret;\n";
        ret += "  })()";
      }

      return ret;
    }

    FLATBUFFERS_ASSERT(0);
    return "";
  }